

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void DumpFunction(Proto *f,TString *psource,DumpState *D)

{
  TValue *pTVar1;
  uint uVar2;
  int x;
  TString *s;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  if (D->strip == 0) {
    s = (TString *)0x0;
    if (f->source != psource) {
      s = f->source;
    }
  }
  else {
    s = (TString *)0x0;
  }
  DumpString(s,D);
  DumpInt(f->linedefined,D);
  DumpInt(f->lastlinedefined,D);
  DumpByte((uint)f->numparams,D);
  DumpByte((uint)f->is_vararg,D);
  DumpByte((uint)f->maxstacksize,D);
  DumpInt(f->sizecode,D);
  DumpBlock(f->code,(long)f->sizecode << 2,D);
  uVar2 = f->sizek;
  DumpInt(uVar2,D);
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  do {
    if (uVar4 * 0x10 == uVar3) {
      uVar2 = f->sizeupvalues;
      DumpInt(uVar2,D);
      uVar4 = 0;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        DumpByte((uint)(&f->upvalues->instack)[uVar4],D);
        DumpByte((uint)(&f->upvalues->idx)[uVar4],D);
      }
      uVar2 = f->sizep;
      DumpInt(uVar2,D);
      uVar4 = 0;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        DumpFunction(f->p[uVar4],f->source,D);
      }
      uVar2 = 0;
      x = 0;
      if (D->strip == 0) {
        x = f->sizelineinfo;
      }
      DumpInt(x,D);
      DumpBlock(f->lineinfo,(long)x << 2,D);
      if (D->strip == 0) {
        uVar2 = f->sizelocvars;
      }
      DumpInt(uVar2,D);
      uVar4 = 0;
      uVar3 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
        DumpString(*(TString **)((long)&f->locvars->varname + uVar4),D);
        DumpInt(*(int *)((long)&f->locvars->startpc + uVar4),D);
        DumpInt(*(int *)((long)&f->locvars->endpc + uVar4),D);
      }
      uVar3 = 0;
      uVar2 = 0;
      if (D->strip == 0) {
        uVar2 = f->sizeupvalues;
      }
      DumpInt(uVar2,D);
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
        DumpString(*(TString **)((long)&f->upvalues->name + uVar3),D);
      }
      return;
    }
    pTVar1 = f->k;
    DumpByte(*(uint *)((long)&pTVar1->tt_ + uVar3) & 0x3f,D);
    uVar2 = *(uint *)((long)&pTVar1->tt_ + uVar3) & 0x3f;
    if (uVar2 == 0x14) {
LAB_001092af:
      DumpString(*(TString **)((long)&pTVar1->value_ + uVar3),D);
    }
    else if (uVar2 == 3) {
      DumpNumber(*(lua_Number *)((long)&pTVar1->value_ + uVar3),D);
    }
    else {
      if (uVar2 == 4) goto LAB_001092af;
      if (uVar2 == 0x13) {
        DumpInteger(*(lua_Integer *)((long)&pTVar1->value_ + uVar3),D);
      }
      else if (uVar2 == 1) {
        DumpByte(*(int *)((long)&pTVar1->value_ + uVar3),D);
      }
    }
    uVar3 = uVar3 + 0x10;
  } while( true );
}

Assistant:

static void DumpFunction (const Proto *f, TString *psource, DumpState *D) {
  if (D->strip || f->source == psource)
    DumpString(NULL, D);  /* no debug info or same source as its parent */
  else
    DumpString(f->source, D);
  DumpInt(f->linedefined, D);
  DumpInt(f->lastlinedefined, D);
  DumpByte(f->numparams, D);
  DumpByte(f->is_vararg, D);
  DumpByte(f->maxstacksize, D);
  DumpCode(f, D);
  DumpConstants(f, D);
  DumpUpvalues(f, D);
  DumpProtos(f, D);
  DumpDebug(f, D);
}